

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O3

cx_string<70UL> * __thiscall
mserialize::cx_strcat<9ul,2ul,58ul,1ul>
          (cx_string<70UL> *__return_storage_ptr__,mserialize *this,cx_string<9UL> *strings,
          cx_string<2UL> *strings_1,cx_string<58UL> *strings_2,cx_string<1UL> *strings_3)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  char buffer [71];
  ulong auStack_b8 [6];
  long lStack_88;
  mserialize *local_80;
  cx_string<9UL> *local_78;
  cx_string<2UL> *local_70;
  cx_string<58UL> *local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined7 uStack_20;
  undefined1 uStack_19;
  undefined7 uStack_18;
  
  puVar1 = &local_58;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_19 = 0;
  uStack_18 = 0;
  local_80 = this;
  local_78 = strings;
  local_70 = strings_1;
  local_68 = strings_2;
  auStack_b8[1] = 9;
  auStack_b8[2] = 2;
  auStack_b8[3] = 0x3a;
  auStack_b8[4] = 1;
  lVar2 = 1;
  do {
    if (auStack_b8[lVar2] != 0) {
      uVar3 = 0;
      do {
        *(undefined1 *)((long)puVar1 + uVar3) = *(undefined1 *)((&lStack_88)[lVar2] + uVar3);
        uVar3 = uVar3 + 1;
      } while (uVar3 < auStack_b8[lVar2]);
      puVar1 = (undefined8 *)((long)puVar1 + uVar3);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  __return_storage_ptr__->_data[0x46] = '\0';
  memcpy(__return_storage_ptr__,&local_58,0x46);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}